

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# net.cpp
# Opt level: O2

bool __thiscall CConnman::DisconnectNode(CConnman *this,string *strNode)

{
  bool bVar1;
  CNode *pCVar2;
  char *args;
  long in_FS_OFFSET;
  string_view logging_function;
  string_view source_file;
  NodeId local_60;
  allocator<char> local_51;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock93;
  string local_40;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  args = "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/net.cpp";
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::UniqueLock
            (&criticalblock93,&this->m_nodes_mutex,"m_nodes_mutex",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/net.cpp"
             ,0xe16,false);
  pCVar2 = FindNode(this,strNode);
  if (pCVar2 != (CNode *)0x0) {
    bVar1 = ::LogAcceptCategory(NET,Debug);
    if (bVar1) {
      if (fLogIPs == true) {
        tinyformat::format<std::__cxx11::string>
                  (&local_40,(tinyformat *)0x6ce012,(char *)strNode,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)args);
      }
      else {
        std::__cxx11::string::string<std::allocator<char>>((string *)&local_40,"",&local_51);
      }
      local_60 = pCVar2->id;
      logging_function._M_str = "DisconnectNode";
      logging_function._M_len = 0xe;
      source_file._M_str =
           "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/net.cpp"
      ;
      source_file._M_len = 0x57;
      LogPrintFormatInternal<std::__cxx11::string,long>
                (logging_function,source_file,0xe18,NET,Debug,(ConstevalFormatString<2U>)0x6882e9,
                 &local_40,&local_60);
      std::__cxx11::string::~string((string *)&local_40);
    }
    LOCK();
    (pCVar2->fDisconnect)._M_base._M_i = true;
    UNLOCK();
  }
  std::unique_lock<std::recursive_mutex>::~unique_lock(&criticalblock93.super_unique_lock);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return pCVar2 != (CNode *)0x0;
  }
  __stack_chk_fail();
}

Assistant:

bool CConnman::DisconnectNode(const std::string& strNode)
{
    LOCK(m_nodes_mutex);
    if (CNode* pnode = FindNode(strNode)) {
        LogDebug(BCLog::NET, "disconnect by address%s matched peer=%d; disconnecting\n", (fLogIPs ? strprintf("=%s", strNode) : ""), pnode->GetId());
        pnode->fDisconnect = true;
        return true;
    }
    return false;
}